

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

bool __thiscall wallet::WalletBatch::IsEncrypted(WalletBatch *this)

{
  _Head_base<0UL,_wallet::DatabaseBatch_*,_false> _Var1;
  int iVar2;
  bool bVar3;
  long in_FS_OFFSET;
  DataStream v;
  DataStream k;
  DataStream prefix;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_88;
  undefined8 uStack_70;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_68;
  undefined8 uStack_50;
  long *local_40;
  DataStream local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.m_read_pos = 0;
  local_38.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Serialize<DataStream,char>
            (&local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             DBKeys::MASTER_KEY_abi_cxx11_);
  _Var1._M_head_impl =
       (this->m_batch)._M_t.
       super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
       _M_t.
       super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
       super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
  (*(_Var1._M_head_impl)->_vptr_DatabaseBatch[10])
            (&local_40,_Var1._M_head_impl,
             local_38.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start + local_38.m_read_pos,
             (long)local_38.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_38.vch.
                    super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start + local_38.m_read_pos));
  if (local_40 != (long *)0x0) {
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uStack_50 = 0;
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uStack_70 = 0;
    local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar2 = (**(code **)(*local_40 + 0x10))();
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_88);
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_68);
    bVar3 = true;
    if (iVar2 == 1) goto LAB_00483474;
  }
  bVar3 = false;
LAB_00483474:
  if (local_40 != (long *)0x0) {
    (**(code **)(*local_40 + 8))();
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::IsEncrypted()
{
    DataStream prefix;
    prefix << DBKeys::MASTER_KEY;
    if (auto cursor = m_batch->GetNewPrefixCursor(prefix)) {
        DataStream k, v;
        if (cursor->Next(k, v) == DatabaseCursor::Status::MORE) return true;
    }
    return false;
}